

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O1

void ui_visuals_module_cleanup(void)

{
  visuals_cycle_group *p;
  visuals_cycler *p_00;
  visuals_flicker *p_01;
  ulong uVar1;
  ulong uVar2;
  
  p_01 = visuals_flicker_table;
  if (visuals_flicker_table != (visuals_flicker *)0x0) {
    if (visuals_flicker_table->cycles != (uint8_t *)0x0) {
      mem_free(visuals_flicker_table->cycles);
      p_01->cycles = (uint8_t *)0x0;
    }
    mem_free(p_01);
  }
  p_00 = visuals_cycler_table;
  if (visuals_cycler_table != (visuals_cycler *)0x0) {
    if (visuals_cycler_table->groups != (visuals_cycle_group **)0x0) {
      if (visuals_cycler_table->max_groups != 0) {
        uVar2 = 0;
        do {
          p = p_00->groups[uVar2];
          if (p != (visuals_cycle_group *)0x0) {
            if (p->cycles != (visuals_color_cycle **)0x0) {
              if (p->max_cycles != 0) {
                uVar1 = 0;
                do {
                  visuals_color_cycle_free(p->cycles[uVar1]);
                  uVar1 = uVar1 + 1;
                } while (uVar1 < p->max_cycles);
              }
              mem_free(p->cycles);
              p->cycles = (visuals_color_cycle **)0x0;
            }
            if (p->group_name != (char *)0x0) {
              string_free(p->group_name);
              p->group_name = (char *)0x0;
            }
            mem_free(p);
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 < p_00->max_groups);
      }
      mem_free(p_00->groups);
      p_00->groups = (visuals_cycle_group **)0x0;
    }
    mem_free(p_00);
  }
  if (visuals_color_cycles_by_race != (anon_struct_24_3_6ed953bc *)0x0) {
    if (visuals_color_cycles_by_race->race != (visuals_color_cycle **)0x0) {
      mem_free(visuals_color_cycles_by_race->race);
      visuals_color_cycles_by_race->race = (visuals_color_cycle **)0x0;
    }
    mem_free(visuals_color_cycles_by_race);
    visuals_color_cycles_by_race = (anon_struct_24_3_6ed953bc *)0x0;
  }
  return;
}

Assistant:

static void ui_visuals_module_cleanup(void)
{
	visuals_flicker_free(visuals_flicker_table);
	visuals_cycler_free(visuals_cycler_table);

	if (visuals_color_cycles_by_race != NULL) {
		if (visuals_color_cycles_by_race->race != NULL) {
			mem_free(visuals_color_cycles_by_race->race);
			visuals_color_cycles_by_race->race = NULL;
		}

		mem_free(visuals_color_cycles_by_race);
		visuals_color_cycles_by_race = NULL;
	}
}